

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O2

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_verifySolutionReal
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  Verbosity VVar1;
  type_conflict5 tVar2;
  SPxOut *pSVar3;
  SPxOut *pSVar4;
  Verbosity old_verbosity;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  redcostviol;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  dualviol;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rowviol;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  boundviol;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumviol;
  Real local_328;
  Real local_320;
  Real local_318;
  Real local_310;
  cpp_dec_float<100U,_int,_void> local_308;
  cpp_dec_float<100U,_int,_void> local_2b8;
  cpp_dec_float<100U,_int,_void> local_268;
  cpp_dec_float<100U,_int,_void> local_218;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  cpp_dec_float<100U,_int,_void> local_80;
  
  pSVar4 = &this->spxout;
  VVar1 = (this->spxout).m_verbosity;
  if (2 < (int)VVar1) {
    (this->spxout).m_verbosity = INFO1;
    pSVar3 = soplex::operator<<(pSVar4," --- verifying computed solution");
    std::endl<char,std::char_traits<char>>(pSVar3->m_streams[pSVar3->m_verbosity]);
    (this->spxout).m_verbosity = VVar1;
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_80,0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_218,0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_268,0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_2b8,0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_308,0,(type *)0x0);
  getBoundViolation(this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_218,
                    (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)&local_80);
  getRowViolation(this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_268,
                  (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)&local_80);
  getDualViolation(this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_2b8,
                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_80);
  getRedCostViolation(this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_308,
                      (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&local_80);
  local_310 = Tolerances::floatingPointFeastol
                        ((this->_solver).
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  tVar2 = boost::multiprecision::operator>=
                    ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_218,&local_310);
  if (!tVar2) {
    local_318 = Tolerances::floatingPointFeastol
                          ((this->_solver).
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ._tolerances.
                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          );
    tVar2 = boost::multiprecision::operator>=
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_268,&local_318);
    if (!tVar2) {
      local_320 = Tolerances::floatingPointOpttol
                            ((this->_solver).
                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ._tolerances.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
      tVar2 = boost::multiprecision::operator>=
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_2b8,&local_320);
      if (!tVar2) {
        local_328 = Tolerances::floatingPointOpttol
                              ((this->_solver).
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ._tolerances.
                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
        tVar2 = boost::multiprecision::operator>=
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_308,&local_328);
        if (!tVar2) {
          return;
        }
      }
    }
  }
  VVar1 = (this->spxout).m_verbosity;
  if ((int)VVar1 < 5) {
    if ((int)VVar1 < 3) goto LAB_0038f695;
  }
  else {
    (this->spxout).m_verbosity = INFO3;
    pSVar3 = soplex::operator<<(pSVar4,"bound violation: ");
    local_d8.m_backend.data._M_elems[0] = local_218.data._M_elems[0];
    local_d8.m_backend.data._M_elems[1] = local_218.data._M_elems[1];
    local_d8.m_backend.data._M_elems[2] = local_218.data._M_elems[2];
    local_d8.m_backend.data._M_elems[3] = local_218.data._M_elems[3];
    local_d8.m_backend.data._M_elems[4] = local_218.data._M_elems[4];
    local_d8.m_backend.data._M_elems[5] = local_218.data._M_elems[5];
    local_d8.m_backend.data._M_elems[6] = local_218.data._M_elems[6];
    local_d8.m_backend.data._M_elems[7] = local_218.data._M_elems[7];
    local_d8.m_backend.data._M_elems[8] = local_218.data._M_elems[8];
    local_d8.m_backend.data._M_elems[9] = local_218.data._M_elems[9];
    local_d8.m_backend.data._M_elems[10] = local_218.data._M_elems[10];
    local_d8.m_backend.data._M_elems[0xb] = local_218.data._M_elems[0xb];
    local_d8.m_backend.data._M_elems[0xc] = local_218.data._M_elems[0xc];
    local_d8.m_backend.data._M_elems[0xd] = local_218.data._M_elems[0xd];
    local_d8.m_backend.data._M_elems[0xe] = local_218.data._M_elems[0xe];
    local_d8.m_backend.data._M_elems[0xf] = local_218.data._M_elems[0xf];
    local_d8.m_backend.exp = local_218.exp;
    local_d8.m_backend.neg = local_218.neg;
    local_d8.m_backend.fpclass = local_218.fpclass;
    local_d8.m_backend.prec_elem = local_218.prec_elem;
    pSVar3 = soplex::operator<<(pSVar3,&local_d8);
    pSVar3 = soplex::operator<<(pSVar3,", row violation: ");
    local_128.m_backend.data._M_elems[0] = local_268.data._M_elems[0];
    local_128.m_backend.data._M_elems[1] = local_268.data._M_elems[1];
    local_128.m_backend.data._M_elems[2] = local_268.data._M_elems[2];
    local_128.m_backend.data._M_elems[3] = local_268.data._M_elems[3];
    local_128.m_backend.data._M_elems[4] = local_268.data._M_elems[4];
    local_128.m_backend.data._M_elems[5] = local_268.data._M_elems[5];
    local_128.m_backend.data._M_elems[6] = local_268.data._M_elems[6];
    local_128.m_backend.data._M_elems[7] = local_268.data._M_elems[7];
    local_128.m_backend.data._M_elems[8] = local_268.data._M_elems[8];
    local_128.m_backend.data._M_elems[9] = local_268.data._M_elems[9];
    local_128.m_backend.data._M_elems[10] = local_268.data._M_elems[10];
    local_128.m_backend.data._M_elems[0xb] = local_268.data._M_elems[0xb];
    local_128.m_backend.data._M_elems[0xc] = local_268.data._M_elems[0xc];
    local_128.m_backend.data._M_elems[0xd] = local_268.data._M_elems[0xd];
    local_128.m_backend.data._M_elems[0xe] = local_268.data._M_elems[0xe];
    local_128.m_backend.data._M_elems[0xf] = local_268.data._M_elems[0xf];
    local_128.m_backend.exp = local_268.exp;
    local_128.m_backend.neg = local_268.neg;
    local_128.m_backend.fpclass = local_268.fpclass;
    local_128.m_backend.prec_elem = local_268.prec_elem;
    pSVar3 = soplex::operator<<(pSVar3,&local_128);
    pSVar3 = soplex::operator<<(pSVar3,", dual violation: ");
    local_178.m_backend.data._M_elems[0] = local_2b8.data._M_elems[0];
    local_178.m_backend.data._M_elems[1] = local_2b8.data._M_elems[1];
    local_178.m_backend.data._M_elems[2] = local_2b8.data._M_elems[2];
    local_178.m_backend.data._M_elems[3] = local_2b8.data._M_elems[3];
    local_178.m_backend.data._M_elems[4] = local_2b8.data._M_elems[4];
    local_178.m_backend.data._M_elems[5] = local_2b8.data._M_elems[5];
    local_178.m_backend.data._M_elems[6] = local_2b8.data._M_elems[6];
    local_178.m_backend.data._M_elems[7] = local_2b8.data._M_elems[7];
    local_178.m_backend.data._M_elems[8] = local_2b8.data._M_elems[8];
    local_178.m_backend.data._M_elems[9] = local_2b8.data._M_elems[9];
    local_178.m_backend.data._M_elems[10] = local_2b8.data._M_elems[10];
    local_178.m_backend.data._M_elems[0xb] = local_2b8.data._M_elems[0xb];
    local_178.m_backend.data._M_elems[0xc] = local_2b8.data._M_elems[0xc];
    local_178.m_backend.data._M_elems[0xd] = local_2b8.data._M_elems[0xd];
    local_178.m_backend.data._M_elems[0xe] = local_2b8.data._M_elems[0xe];
    local_178.m_backend.data._M_elems[0xf] = local_2b8.data._M_elems[0xf];
    local_178.m_backend.exp = local_2b8.exp;
    local_178.m_backend.neg = local_2b8.neg;
    local_178.m_backend.fpclass = local_2b8.fpclass;
    local_178.m_backend.prec_elem = local_2b8.prec_elem;
    pSVar3 = soplex::operator<<(pSVar3,&local_178);
    pSVar3 = soplex::operator<<(pSVar3,", redcost violation: ");
    local_1c8.m_backend.data._M_elems[0] = local_308.data._M_elems[0];
    local_1c8.m_backend.data._M_elems[1] = local_308.data._M_elems[1];
    local_1c8.m_backend.data._M_elems[2] = local_308.data._M_elems[2];
    local_1c8.m_backend.data._M_elems[3] = local_308.data._M_elems[3];
    local_1c8.m_backend.data._M_elems[4] = local_308.data._M_elems[4];
    local_1c8.m_backend.data._M_elems[5] = local_308.data._M_elems[5];
    local_1c8.m_backend.data._M_elems[6] = local_308.data._M_elems[6];
    local_1c8.m_backend.data._M_elems[7] = local_308.data._M_elems[7];
    local_1c8.m_backend.data._M_elems[8] = local_308.data._M_elems[8];
    local_1c8.m_backend.data._M_elems[9] = local_308.data._M_elems[9];
    local_1c8.m_backend.data._M_elems[10] = local_308.data._M_elems[10];
    local_1c8.m_backend.data._M_elems[0xb] = local_308.data._M_elems[0xb];
    local_1c8.m_backend.data._M_elems[0xc] = local_308.data._M_elems[0xc];
    local_1c8.m_backend.data._M_elems[0xd] = local_308.data._M_elems[0xd];
    local_1c8.m_backend.data._M_elems[0xe] = local_308.data._M_elems[0xe];
    local_1c8.m_backend.data._M_elems[0xf] = local_308.data._M_elems[0xf];
    local_1c8.m_backend.exp = local_308.exp;
    local_1c8.m_backend.neg = local_308.neg;
    local_1c8.m_backend.fpclass = local_308.fpclass;
    local_1c8.m_backend.prec_elem = local_308.prec_elem;
    pSVar3 = soplex::operator<<(pSVar3,&local_1c8);
    std::endl<char,std::char_traits<char>>(pSVar3->m_streams[pSVar3->m_verbosity]);
  }
  (this->spxout).m_verbosity = INFO1;
  pSVar4 = soplex::operator<<(pSVar4,
                              " --- detected violations in original problem space -- solve again without presolving/scaling"
                             );
  std::endl<char,std::char_traits<char>>(pSVar4->m_streams[pSVar4->m_verbosity]);
  (this->spxout).m_verbosity = VVar1;
LAB_0038f695:
  if (this->_isRealLPScaled == true) {
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::unscaleLPandReloadBasis(&this->_solver);
    this->_isRealLPScaled = false;
    this->_unscaleCalls = this->_unscaleCalls + 1;
  }
  _preprocessAndSolveReal(this,false,(bool *)0x0);
  return;
}

Assistant:

void SoPlexBase<R>::_verifySolutionReal()
{
   assert(_hasSolReal);

   SPX_MSG_INFO1(spxout, spxout << " --- verifying computed solution" << std::endl;)

   R sumviol = 0;
   R boundviol = 0;
   R rowviol = 0;
   R dualviol = 0;
   R redcostviol = 0;

   (void) getBoundViolation(boundviol, sumviol);
   (void) getRowViolation(rowviol, sumviol);
   (void) getDualViolation(dualviol, sumviol);
   (void) getRedCostViolation(redcostviol, sumviol);

   if(boundviol >= _solver.tolerances()->floatingPointFeastol()
         || rowviol >= _solver.tolerances()->floatingPointFeastol()
         || dualviol >= _solver.tolerances()->floatingPointOpttol()
         || redcostviol >= _solver.tolerances()->floatingPointOpttol())
   {
      assert(&_solver == _realLP);
      assert(_isRealLPLoaded);
      SPX_MSG_INFO3(spxout, spxout << "bound violation: " << boundviol
                    << ", row violation: " << rowviol
                    << ", dual violation: " << dualviol
                    << ", redcost violation: " << redcostviol << std::endl;)
      SPX_MSG_INFO1(spxout, spxout <<
                    " --- detected violations in original problem space -- solve again without presolving/scaling" <<
                    std::endl;)

      if(_isRealLPScaled)
      {
         _solver.unscaleLPandReloadBasis();
         _isRealLPScaled = false;
         ++_unscaleCalls;
      }

      _preprocessAndSolveReal(false);
   }
}